

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsocks5socketengine.cpp
# Opt level: O3

void __thiscall QSocks5BindStore::QSocks5BindStore(QSocks5BindStore *this)

{
  long lVar1;
  long lVar2;
  undefined8 uVar3;
  
  QObject::QObject(&this->super_QObject,(QObject *)0x0);
  *(undefined ***)this = &PTR_metaObject_002d01e0;
  (this->mutex).owner.super_QBasicAtomicPointer<void>._q_value._M_b._M_p = (__pointer_type)0x0;
  (this->mutex).count = 0;
  (this->mutex).mutex.super_QBasicMutex.d_ptr._q_value._M_b._M_p = (__pointer_type)0x0;
  (this->sweepTimer).m_id = Invalid;
  (this->store).d = (Data *)0x0;
  if (QCoreApplication::self != 0) {
    lVar1 = QObject::thread();
    lVar2 = QObject::thread();
    if (lVar1 != lVar2) {
      uVar3 = QObject::thread();
      QObject::moveToThread(this,uVar3);
      return;
    }
  }
  return;
}

Assistant:

QSocks5BindStore::QSocks5BindStore()
{
    QCoreApplication *app = QCoreApplication::instance();
    if (app && app->thread() != thread())
        moveToThread(app->thread());
}